

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O0

void TxInErrorToJSON(CTxIn *txin,UniValue *vErrorsRet,string *strMessage)

{
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  UniValue *this;
  UniValue *pUVar1;
  UniValue *in_RSI;
  uchar *in_RDI;
  long in_FS_OFFSET;
  uint i;
  UniValue witness;
  UniValue entry;
  UniValue *in_stack_fffffffffffffa48;
  UniValue *in_stack_fffffffffffffa50;
  UniValue *in_stack_fffffffffffffa58;
  UniValue *pUVar2;
  UniValue *in_stack_fffffffffffffa60;
  UniValue *this_00;
  UniValue *in_stack_fffffffffffffa68;
  UniValue *in_stack_fffffffffffffa80;
  UniValue *in_stack_fffffffffffffa88;
  UniValue *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  uint local_550;
  size_t in_stack_fffffffffffffad8;
  allocator<char> local_511 [23];
  allocator<char> local_4fa;
  undefined1 local_4f9 [31];
  undefined1 local_4da [2];
  UniValue local_4d8 [8];
  UniValue local_208 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60);
  UniValue::UniValue(in_stack_fffffffffffffa68,(VType)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                     (string *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,
             (allocator<char> *)in_stack_fffffffffffffa88);
  transaction_identifier<false>::ToString_abi_cxx11_
            ((transaction_identifier<false> *)in_stack_fffffffffffffa50);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffa88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa80);
  UniValue::pushKV(in_stack_fffffffffffffa90,(string *)in_stack_fffffffffffffa88,
                   in_stack_fffffffffffffa80);
  UniValue::~UniValue(in_stack_fffffffffffffa48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa48);
  std::allocator<char>::~allocator((allocator<char> *)(local_4da + 1));
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4da;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)in_stack_fffffffffffffa90,(allocator<char> *)in_stack_fffffffffffffa88)
  ;
  local_4f9._17_8_ = ZEXT48(*(uint *)(in_RDI + 0x20));
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>
            (in_stack_fffffffffffffa88,(unsigned_long *)in_stack_fffffffffffffa80);
  UniValue::pushKV(in_stack_fffffffffffffa90,(string *)in_stack_fffffffffffffa88,
                   in_stack_fffffffffffffa80);
  UniValue::~UniValue(in_stack_fffffffffffffa48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa48);
  std::allocator<char>::~allocator((allocator<char> *)local_4da);
  pUVar2 = local_208;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60);
  UniValue::UniValue(in_stack_fffffffffffffa68,(VType)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                     (string *)in_stack_fffffffffffffa58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa48);
  local_550 = 0;
  while( true ) {
    this = (UniValue *)(ulong)local_550;
    pUVar1 = (UniValue *)
             std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)in_stack_fffffffffffffa48);
    if (pUVar1 <= this) break;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffa58,(size_type)in_stack_fffffffffffffa50);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffa58,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa50,
               in_stack_fffffffffffffa48);
    s.m_size = in_stack_fffffffffffffad8;
    s.m_data = in_RDI;
    HexStr_abi_cxx11_(s);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffa80);
    UniValue::push_back(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    UniValue::~UniValue(in_stack_fffffffffffffa48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa48);
    local_550 = local_550 + 1;
  }
  pUVar1 = (UniValue *)local_4f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)pUVar2,(allocator<char> *)this)
  ;
  UniValue::UniValue(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  UniValue::pushKV(pUVar2,(string *)this,pUVar1);
  UniValue::~UniValue(in_stack_fffffffffffffa48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa48);
  std::allocator<char>::~allocator((allocator<char> *)local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)pUVar2,(allocator<char> *)this)
  ;
  Span<const_unsigned_char>::Span<CScript>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffa58,
             (CScript *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  s_00.m_size = in_stack_fffffffffffffad8;
  s_00.m_data = in_RDI;
  HexStr_abi_cxx11_(s_00);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pUVar1);
  UniValue::pushKV(pUVar2,(string *)this,pUVar1);
  UniValue::~UniValue(in_stack_fffffffffffffa48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa48);
  std::allocator<char>::~allocator(&local_4fa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)pUVar2,(allocator<char> *)this)
  ;
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>(this,(unsigned_long *)pUVar1);
  UniValue::pushKV(pUVar2,(string *)this,pUVar1);
  UniValue::~UniValue(in_stack_fffffffffffffa48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa48);
  std::allocator<char>::~allocator(local_511);
  this_00 = (UniValue *)&stack0xfffffffffffffadf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)pUVar2,(allocator<char> *)this)
  ;
  UniValue::
  UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pUVar1);
  UniValue::pushKV(pUVar2,(string *)this,pUVar1);
  UniValue::~UniValue(in_stack_fffffffffffffa48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffadf);
  pUVar2 = local_4d8;
  UniValue::UniValue(pUVar2,in_RSI);
  UniValue::push_back(this_00,pUVar2);
  UniValue::~UniValue(in_stack_fffffffffffffa48);
  UniValue::~UniValue(in_stack_fffffffffffffa48);
  UniValue::~UniValue(in_stack_fffffffffffffa48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TxInErrorToJSON(const CTxIn& txin, UniValue& vErrorsRet, const std::string& strMessage)
{
    UniValue entry(UniValue::VOBJ);
    entry.pushKV("txid", txin.prevout.hash.ToString());
    entry.pushKV("vout", (uint64_t)txin.prevout.n);
    UniValue witness(UniValue::VARR);
    for (unsigned int i = 0; i < txin.scriptWitness.stack.size(); i++) {
        witness.push_back(HexStr(txin.scriptWitness.stack[i]));
    }
    entry.pushKV("witness", std::move(witness));
    entry.pushKV("scriptSig", HexStr(txin.scriptSig));
    entry.pushKV("sequence", (uint64_t)txin.nSequence);
    entry.pushKV("error", strMessage);
    vErrorsRet.push_back(std::move(entry));
}